

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void emit_return(JSParseState *s,BOOL hasval)

{
  char cVar1;
  uint8_t uVar2;
  byte val;
  int iVar3;
  int label;
  BlockEnv *pBVar4;
  uint8_t local_3e [8];
  uint8_t local_36 [6];
  
  pBVar4 = s->cur_func->top_break;
  if (pBVar4 != (BlockEnv *)0x0) {
    iVar3 = 0;
    do {
      if (pBVar4->has_iterator != 0) {
        if (hasval == 0) {
          emit_op(s,'\x06');
        }
        emit_op(s,0x84);
        uVar2 = 0x83;
        if (s->cur_func->field_0x84 == '\x03') {
          emit_op(s,'\x0e');
          emit_op(s,'\x0e');
          emit_op(s,'B');
          local_3e[2] = '\x06';
          local_3e[3] = '\0';
          local_3e[4] = '\0';
          local_3e[5] = '\0';
          dbuf_put(&s->cur_func->byte_code,local_3e + 2,4);
          emit_op(s,'\x11');
          emit_op(s,0xb0);
          iVar3 = emit_goto(s,0x6a,-1);
          emit_op(s,'$');
          local_3e[0] = '\0';
          local_3e[1] = '\0';
          dbuf_put(&s->cur_func->byte_code,local_3e,2);
          emit_op(s,0x81);
          emit_op(s,0x8b);
          label = emit_goto(s,0x6b,-1);
          emit_label(s,iVar3);
          emit_op(s,'\x0e');
          emit_label(s,label);
          uVar2 = '\x0e';
        }
        emit_op(s,uVar2);
        hasval = 1;
        iVar3 = -3;
      }
      iVar3 = iVar3 + pBVar4->drop_count;
      if (pBVar4->label_finally != -1) {
        if (iVar3 != 0) {
          do {
            emit_op(s,hasval == 0 ^ 0xf);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        if (hasval == 0) {
          emit_op(s,'\x06');
        }
        emit_goto(s,0x6d,pBVar4->label_finally);
        hasval = 1;
        iVar3 = 0;
      }
      pBVar4 = pBVar4->prev;
    } while (pBVar4 != (BlockEnv *)0x0);
  }
  if (s->cur_func->is_derived_class_constructor == 0) {
    cVar1 = s->cur_func->field_0x84;
    if (cVar1 == '\0') {
      val = hasval == 0 | 0x28;
    }
    else {
      if (hasval == 0) {
        uVar2 = '\x06';
      }
      else {
        val = 0x2e;
        uVar2 = 0x8b;
        if (cVar1 != '\x03') goto LAB_00159999;
      }
      emit_op(s,uVar2);
      val = 0x2e;
    }
  }
  else {
    if (hasval == 0) {
      iVar3 = -1;
    }
    else {
      emit_op(s,'*');
      iVar3 = emit_goto(s,0x69,-1);
      emit_op(s,'\x0e');
    }
    emit_op(s,0xb6);
    local_36[2] = '\b';
    local_36[3] = '\0';
    local_36[4] = '\0';
    local_36[5] = '\0';
    dbuf_put(&s->cur_func->byte_code,local_36 + 2,4);
    local_36[0] = '\0';
    local_36[1] = '\0';
    dbuf_put(&s->cur_func->byte_code,local_36,2);
    emit_label(s,iVar3);
    val = 0x28;
  }
LAB_00159999:
  emit_op(s,val);
  return;
}

Assistant:

static void emit_return(JSParseState *s, BOOL hasval)
{
    BlockEnv *top;
    int drop_count;

    drop_count = 0;
    top = s->cur_func->top_break;
    while (top != NULL) {
        /* XXX: emit the appropriate OP_leave_scope opcodes? Probably not
           required as all local variables will be closed upon returning
           from JS_CallInternal, but not in the same order. */
        if (top->has_iterator) {
            /* with 'yield', the exact number of OP_drop to emit is
               unknown, so we use a specific operation to look for
               the catch offset */
            if (!hasval) {
                emit_op(s, OP_undefined);
                hasval = TRUE;
            }
            emit_op(s, OP_iterator_close_return);
            if (s->cur_func->func_kind == JS_FUNC_ASYNC_GENERATOR) {
                int label_next, label_next2;

                emit_op(s, OP_drop); /* catch offset */
                emit_op(s, OP_drop); /* next */
                emit_op(s, OP_get_field2);
                emit_atom(s, JS_ATOM_return);
                /* stack: iter_obj return_func */
                emit_op(s, OP_dup);
                emit_op(s, OP_is_undefined_or_null);
                label_next = emit_goto(s, OP_if_true, -1);
                emit_op(s, OP_call_method);
                emit_u16(s, 0);
                emit_op(s, OP_iterator_check_object);
                emit_op(s, OP_await);
                label_next2 = emit_goto(s, OP_goto, -1);
                emit_label(s, label_next);
                emit_op(s, OP_drop);
                emit_label(s, label_next2);
                emit_op(s, OP_drop);
            } else {
                emit_op(s, OP_iterator_close);
            }
            drop_count = -3;
        }
        drop_count += top->drop_count;
        if (top->label_finally != -1) {
            while(drop_count) {
                /* must keep the stack top if hasval */
                emit_op(s, hasval ? OP_nip : OP_drop);
                drop_count--;
            }
            if (!hasval) {
                /* must push return value to keep same stack size */
                emit_op(s, OP_undefined);
                hasval = TRUE;
            }
            emit_goto(s, OP_gosub, top->label_finally);
        }
        top = top->prev;
    }
    if (s->cur_func->is_derived_class_constructor) {
        int label_return;

        /* 'this' can be uninitialized, so it may be accessed only if
           the derived class constructor does not return an object */
        if (hasval) {
            emit_op(s, OP_check_ctor_return);
            label_return = emit_goto(s, OP_if_false, -1);
            emit_op(s, OP_drop);
        } else {
            label_return = -1;
        }

        /* XXX: if this is not initialized, should throw the
           ReferenceError in the caller realm */
        emit_op(s, OP_scope_get_var);
        emit_atom(s, JS_ATOM_this);
        emit_u16(s, 0);

        emit_label(s, label_return);
        emit_op(s, OP_return);
    } else if (s->cur_func->func_kind != JS_FUNC_NORMAL) {
        if (!hasval) {
            emit_op(s, OP_undefined);
        } else if (s->cur_func->func_kind == JS_FUNC_ASYNC_GENERATOR) {
            emit_op(s, OP_await);
        }
        emit_op(s, OP_return_async);
    } else {
        emit_op(s, hasval ? OP_return : OP_return_undef);
    }
}